

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinc_resampler.cc
# Opt level: O1

void __thiscall webrtc::SincResampler::Flush(SincResampler *this)

{
  this->virtual_source_idx_ = 0.0;
  this->buffer_primed_ = false;
  memset((this->input_buffer_)._M_t.super___uniq_ptr_impl<float,_webrtc::AlignedFreeDeleter>._M_t.
         super__Tuple_impl<0UL,_float_*,_webrtc::AlignedFreeDeleter>.
         super__Head_base<0UL,_float_*,_false>._M_head_impl,0,this->input_buffer_size_ << 2);
  UpdateRegions(this,false);
  return;
}

Assistant:

void SincResampler::Flush() {
  virtual_source_idx_ = 0;
  buffer_primed_ = false;
  memset(input_buffer_.get(), 0,
         sizeof(*input_buffer_.get()) * input_buffer_size_);
  UpdateRegions(false);
}